

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::system_error::system_error<int,int>
          (system_error *this,int error_code,string_view message,int *args,int *args_1)

{
  uint in_ESI;
  system_error *in_RDI;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int,_int>
  *in_stack_ffffffffffffff68;
  
  std::runtime_error::runtime_error(&in_RDI->super_runtime_error,"");
  *(undefined ***)in_RDI = &PTR__system_error_003d5b28;
  make_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int>
            ((int *)in_RDI,(int *)in_stack_ffffffffffffff68);
  format_args::
  format_args<fmt::v5::format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int>>
            ((format_args *)in_RDI,in_stack_ffffffffffffff68);
  init(in_RDI,(EVP_PKEY_CTX *)(ulong)in_ESI);
  return;
}

Assistant:

system_error(int error_code, string_view message, const Args &... args)
    : std::runtime_error("") {
    init(error_code, message, make_format_args(args...));
  }